

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

void __thiscall
cmFindLibraryCommand::AddArchitecturePath
          (cmFindLibraryCommand *this,string *dir,size_type start_pos,char *suffix,bool fresh)

{
  bool bVar1;
  long lVar2;
  size_t sVar3;
  string next_dir;
  string cur_dir;
  string local_50 [32];
  
  lVar2 = std::__cxx11::string::find((char *)dir,0x56687f);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&cur_dir,(ulong)dir);
    std::operator+(&next_dir,&cur_dir,suffix);
    bVar1 = cmsys::SystemTools::FileIsDirectory(&next_dir);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)dir);
      std::__cxx11::string::append((string *)&next_dir);
      std::__cxx11::string::~string(local_50);
      sVar3 = strlen(suffix);
      AddArchitecturePath(this,&next_dir,lVar2 + sVar3 + 4,suffix,true);
    }
    bVar1 = cmsys::SystemTools::FileIsDirectory(&cur_dir);
    if (bVar1) {
      AddArchitecturePath(this,dir,lVar2 + 4,suffix,false);
    }
    std::__cxx11::string::~string((string *)&next_dir);
    std::__cxx11::string::~string((string *)&cur_dir);
  }
  if (fresh) {
    std::operator+(&next_dir,dir,suffix);
    std::operator+(&cur_dir,&next_dir,"/");
    std::__cxx11::string::~string((string *)&next_dir);
    bVar1 = cmsys::SystemTools::FileIsDirectory(&cur_dir);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,&cur_dir);
    }
    bVar1 = cmsys::SystemTools::FileIsDirectory(dir);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,dir);
    }
    std::__cxx11::string::~string((string *)&cur_dir);
  }
  return;
}

Assistant:

void cmFindLibraryCommand::AddArchitecturePath(
  std::string const& dir, std::string::size_type start_pos,
  const char* suffix, bool fresh)
{
  std::string::size_type pos = dir.find("lib/", start_pos);
  if(pos != std::string::npos)
    {
    std::string cur_dir  = dir.substr(0,pos+3);

    // Follow "lib<suffix>".
    std::string next_dir = cur_dir + suffix;
    if(cmSystemTools::FileIsDirectory(next_dir))
      {
      next_dir += dir.substr(pos+3);
      std::string::size_type next_pos = pos+3+strlen(suffix)+1;
      this->AddArchitecturePath(next_dir, next_pos, suffix);
      }

    // Follow "lib".
    if(cmSystemTools::FileIsDirectory(cur_dir))
      {
      this->AddArchitecturePath(dir, pos+3+1, suffix, false);
      }
    }
  if(fresh)
    {
    // Check for <dir><suffix>/.
    std::string cur_dir  = dir + suffix + "/";
    if(cmSystemTools::FileIsDirectory(cur_dir))
      {
      this->SearchPaths.push_back(cur_dir);
      }

    // Now add the original unchanged path
    if(cmSystemTools::FileIsDirectory(dir))
      {
      this->SearchPaths.push_back(dir);
      }
    }
}